

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::InterpFixupPass::Process(InterpFixupPass *this)

{
  IRContext *ctx;
  IRContext *ctx_00;
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
  this_00;
  __uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
  this_01;
  Status SVar3;
  pointer puVar4;
  bool changed;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  InstructionFolder folder;
  
  changed = false;
  ctx = (this->super_Pass).context_;
  this_00.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
        )::operator_new(0x90);
  FoldingRules::FoldingRules
            ((FoldingRules *)
             this_00.
             super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl,ctx);
  *(undefined ***)
   this_00.
   super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
   .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       &PTR__FoldingRules_00a70260;
  ctx_00 = (this->super_Pass).context_;
  this_01.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
        )::operator_new(0x90);
  ConstantFoldingRules::ConstantFoldingRules
            ((ConstantFoldingRules *)
             this_01.
             super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl,
             ctx_00);
  *(undefined ***)
   this_01.
   super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
   .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       &PTR__ConstantFoldingRules_00a702a0;
  folder.context_ = ctx;
  folder.const_folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
          )this_01.
           super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
           .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl;
  folder.folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
           .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl;
  (**(code **)(*(long *)this_00.
                        super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl +
              0x10))(this_00.
                     super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                     .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl);
  (**(code **)(*(long *)this_01.
                        super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                        _M_head_impl + 0x10))
            (this_01.
             super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  for (puVar4 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    local_68._M_unused._M_object = &changed;
    local_50 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
               ::_M_manager;
    local_68._8_8_ = &folder;
    opt::Function::ForEachInst
              ((Function *)
               (puVar4->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ,(function<void_(spvtools::opt::Instruction_*)> *)&local_68,false,false);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  SVar3 = (Status)changed;
  InstructionFolder::~InstructionFolder(&folder);
  return SVar3 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status InterpFixupPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<InterpFoldingRules>(new InterpFoldingRules(context())),
      MakeUnique<InterpConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}